

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O0

void __thiscall
wasm::GeneticLearner<Order,_double,_Generator>::sort(GeneticLearner<Order,_double,_Generator> *this)

{
  iterator iVar1;
  iterator iVar2;
  GeneticLearner<Order,_double,_Generator> *this_local;
  
  iVar1 = std::
          vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
          ::begin(&this->population);
  iVar2 = std::
          vector<std::unique_ptr<Order,_std::default_delete<Order>_>,_std::allocator<std::unique_ptr<Order,_std::default_delete<Order>_>_>_>
          ::end(&this->population);
  std::
  sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>*,std::vector<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>,std::allocator<std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>>>>,wasm::GeneticLearner<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,double,wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator>::sort()::_lambda(std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&,std::unique_ptr<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order,std::default_delete<wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order>>const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

void sort() {
    std::sort(population.begin(),
              population.end(),
              [](const unique_ptr& left, const unique_ptr& right) {
                return left->getFitness() > right->getFitness();
              });
  }